

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseEmitter::_emitOpArray
          (BaseEmitter *this,InstId instId,Operand_ *operands,size_t opCount)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  Operand_ opExt [3];
  Operand_ *op;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  Error local_34;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  switch(in_RCX) {
  case 0:
    local_34 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_ESI,EmitterUtils::noExt,0x2000f0,0x200100);
    break;
  case 1:
    local_34 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_ESI,in_RDX,0x2000f0,0x200100);
    break;
  case 2:
    local_34 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_ESI,in_RDX,in_RDX + 0x10,0x200100);
    break;
  case 3:
    local_34 = (**(code **)(*in_RDI + 0x38))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,EmitterUtils::noExt);
    break;
  case 4:
    local_98 = *(undefined8 *)(in_RDX + 0x30);
    local_90 = *(undefined8 *)(in_RDX + 0x38);
    local_20 = &local_88;
    local_28 = &local_78;
    local_78 = 0;
    local_74 = 0;
    local_70 = 0;
    local_6c = 0;
    local_18 = local_20;
    local_10 = local_28;
    local_34 = (**(code **)(*in_RDI + 0x38))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,&local_98);
    break;
  case 5:
    local_98 = *(undefined8 *)(in_RDX + 0x30);
    local_90 = *(undefined8 *)(in_RDX + 0x38);
    local_88 = *(undefined8 *)(in_RDX + 0x40);
    local_80 = *(undefined8 *)(in_RDX + 0x48);
    local_30 = &local_78;
    local_78 = 0;
    local_74 = 0;
    local_70 = 0;
    local_6c = 0;
    local_8 = local_30;
    local_34 = (**(code **)(*in_RDI + 0x38))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,&local_98);
    break;
  case 6:
    local_34 = (**(code **)(*in_RDI + 0x38))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30);
    break;
  default:
    local_34 = DebugUtils::errored(2);
  }
  return local_34;
}

Assistant:

Error BaseEmitter::_emitOpArray(InstId instId, const Operand_* operands, size_t opCount) {
  const Operand_* op = operands;
  Operand_ opExt[3];

  switch (opCount) {
    case 0:
      return _emit(instId, noExt[0], noExt[1], noExt[2], noExt);

    case 1:
      return _emit(instId, op[0], noExt[1], noExt[2], noExt);

    case 2:
      return _emit(instId, op[0], op[1], noExt[2], noExt);

    case 3:
      return _emit(instId, op[0], op[1], op[2], noExt);

    case 4:
      opExt[0] = op[3];
      opExt[1].reset();
      opExt[2].reset();
      return _emit(instId, op[0], op[1], op[2], opExt);

    case 5:
      opExt[0] = op[3];
      opExt[1] = op[4];
      opExt[2].reset();
      return _emit(instId, op[0], op[1], op[2], opExt);

    case 6:
      return _emit(instId, op[0], op[1], op[2], op + 3);

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }
}